

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudo-types.cpp
# Opt level: O0

void __thiscall
yactfr::internal::PseudoDst::PseudoDst
          (PseudoDst *this,TypeId id,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *ns,optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *name,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *uid,Up *pseudoPktCtxType,Up *pseudoErHeaderType,Up *pseudoErCommonCtxType,
          ClockType *defClkType,Up *attrs)

{
  unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> local_40;
  Up *local_38;
  Up *pseudoPktCtxType_local;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *uid_local;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *name_local;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ns_local;
  TypeId id_local;
  PseudoDst *this_local;
  
  local_38 = pseudoPktCtxType;
  pseudoPktCtxType_local = (Up *)uid;
  uid_local = name;
  name_local = ns;
  ns_local = (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)id;
  id_local = (TypeId)this;
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::unique_ptr
            (&local_40,attrs);
  WithAttrsMixin::WithAttrsMixin(&this->super_WithAttrsMixin,&local_40);
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            (&local_40);
  this->_id = (TypeId)ns_local;
  boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::optional(&this->_ns,ns);
  boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::optional(&this->_name,name);
  boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::optional(&this->_uid,uid);
  std::unique_ptr<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>::
  unique_ptr(&this->_pseudoPktCtxType,pseudoPktCtxType);
  std::unique_ptr<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>::
  unique_ptr(&this->_pseudoErHeaderType,pseudoErHeaderType);
  std::unique_ptr<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>::
  unique_ptr(&this->_pseudoErCommonCtxType,pseudoErCommonCtxType);
  this->_defClkType = defClkType;
  return;
}

Assistant:

PseudoDst::PseudoDst(const TypeId id, boost::optional<std::string> ns,
                     boost::optional<std::string> name, boost::optional<std::string> uid,
                     PseudoDt::Up pseudoPktCtxType, PseudoDt::Up pseudoErHeaderType,
                     PseudoDt::Up pseudoErCommonCtxType, const ClockType * const defClkType,
                     MapItem::Up attrs) :
    WithAttrsMixin {std::move(attrs)},
    _id {id},
    _ns {std::move(ns)},
    _name {std::move(name)},
    _uid {std::move(uid)},
    _pseudoPktCtxType {std::move(pseudoPktCtxType)},
    _pseudoErHeaderType {std::move(pseudoErHeaderType)},
    _pseudoErCommonCtxType {std::move(pseudoErCommonCtxType)},
    _defClkType {defClkType}
{
}